

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O3

void use_magic_whistle(obj *obj)

{
  monst *pmVar1;
  monst *mtmp;
  boolean bVar2;
  uint uVar3;
  int iVar4;
  obj *poVar5;
  char *pcVar6;
  
  if (((obj->field_0x4a & 1) == 0) || (uVar3 = mt_random(), (uVar3 & 1) != 0)) {
    pcVar6 = "strange";
    if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
      if (u.umonnum == u.umonster) {
        pcVar6 = "normal";
      }
      else {
        bVar2 = dmgtype(youmonst.data,0x24);
        pcVar6 = "strange";
        if (bVar2 == '\0') {
          pcVar6 = "normal";
        }
      }
    }
    pline("You produce a %s whistling sound.",pcVar6);
    pmVar1 = level->monlist;
    while (mtmp = pmVar1, mtmp != (monst *)0x0) {
      pmVar1 = mtmp->nmon;
      if ((0 < mtmp->mhp) && (mtmp->mtame != '\0')) {
        if ((*(uint *)&mtmp->field_0x60 >> 0x17 & 1) != 0) {
          *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xff7fffff;
          fill_pit(level,(int)mtmp->mx,(int)mtmp->my);
        }
        mnexto(mtmp);
        if (mtmp->wormno == '\0') {
          if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_00145f52;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00145ef5;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00145eec;
          }
          else {
LAB_00145eec:
            if (ublindf == (obj *)0x0) goto LAB_00145fa3;
LAB_00145ef5:
            if (ublindf->oartifact != '\x1d') goto LAB_00145fa3;
          }
          if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
               (((youmonst.data)->mflags3 & 0x100) != 0)) &&
              ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)) && ((mtmp->data->mflags3 & 0x200) != 0))
          goto LAB_00145f52;
LAB_00145fa3:
          if (((mtmp->data->mflags1 & 0x10000) == 0) &&
             ((poVar5 = which_armor(mtmp,4), poVar5 == (obj *)0x0 ||
              (poVar5 = which_armor(mtmp,4), poVar5->otyp != 0x4f)))) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00145ff4;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00145fef;
            }
            else {
LAB_00145fef:
              if (ublindf != (obj *)0x0) {
LAB_00145ff4:
                if (ublindf->oartifact == '\x1d') goto LAB_00146062;
              }
              if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                   (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                   youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0))
              goto LAB_001460af;
            }
LAB_00146062:
            if ((u.uprops[0x19].extrinsic != 0) &&
               ((u.uprops[0x19].blocked == 0 &&
                (iVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar4 < 0x41))))
            goto LAB_001460af;
          }
          if ((u.uprops[0x42].intrinsic == 0) && (u.uprops[0x42].extrinsic == 0)) {
            match_warn_of_mon(mtmp);
          }
        }
        else {
          bVar2 = worm_known(level,mtmp);
          if (bVar2 == '\0') goto LAB_00145fa3;
LAB_00145f52:
          uVar3 = *(uint *)&mtmp->field_0x60;
          if ((((uVar3 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
             (u.uprops[0xc].extrinsic == 0)) {
            if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
            goto LAB_00145f95;
            goto LAB_00145fa3;
          }
          if ((uVar3 & 0x280) != 0) goto LAB_00145fa3;
LAB_00145f95:
          if ((u._1052_1_ & 0x20) != 0) goto LAB_00145fa3;
        }
LAB_001460af:
        iVar4 = mintrap(mtmp);
        if (iVar4 == 2) {
          change_luck(-1);
        }
      }
    }
  }
  else {
    pline("You produce a high-pitched humming noise.");
    wake_nearby();
  }
  makeknown_msg((int)obj->otyp);
  return;
}

Assistant:

static void use_magic_whistle(struct obj *obj)
{
	struct monst *mtmp, *nextmon;

	if (obj->cursed && !rn2(2)) {
		pline("You produce a high-pitched humming noise.");
		wake_nearby();
	} else {
		int pet_cnt = 0;
		pline(whistle_str, Hallucination ? "normal" : "strange");
		for (mtmp = level->monlist; mtmp; mtmp = nextmon) {
		    nextmon = mtmp->nmon; /* trap might kill mon */
		    if (DEADMONSTER(mtmp)) continue;
		    if (mtmp->mtame) {
			if (mtmp->mtrapped) {
			    /* no longer in previous trap (affects mintrap) */
			    mtmp->mtrapped = 0;
			    fill_pit(level, mtmp->mx, mtmp->my);
			}
			mnexto(mtmp);
			if (canspotmon(level, mtmp)) ++pet_cnt;
			if (mintrap(mtmp) == 2) change_luck(-1);
		    }
		}
	}
	makeknown_msg(obj->otyp);
}